

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O0

bool __thiscall helics::BrokerBase::setBrokerState(BrokerBase *this,BrokerState newState)

{
  BrokerState BVar1;
  BrokerState in_SI;
  long in_RDI;
  BrokerState currentState;
  BrokerState local_12;
  
  BVar1 = CLI::std::atomic<helics::BrokerBase::BrokerState>::load
                    ((atomic<helics::BrokerBase::BrokerState> *)(in_RDI + 0x290),seq_cst);
  if (BVar1 == CONNECTED_ERROR) {
    if (in_SI == TERMINATING) {
      local_12 = TERMINATING_ERROR;
    }
    else {
      if ((in_SI != TERMINATED) && (in_SI != ERRORED)) {
        return in_SI == CONNECTED_ERROR;
      }
      local_12 = ERRORED;
    }
  }
  else if (BVar1 == TERMINATING_ERROR) {
    if ((in_SI != TERMINATED) && (in_SI != ERRORED)) {
      return in_SI == TERMINATING_ERROR;
    }
    local_12 = ERRORED;
  }
  else {
    if (BVar1 == ERRORED) {
      return in_SI == ERRORED;
    }
    local_12 = in_SI;
    if (((in_SI == ERRORED) && (CONNECTING < BVar1)) && (BVar1 < TERMINATING)) {
      local_12 = CONNECTED_ERROR;
    }
  }
  CLI::std::atomic<helics::BrokerBase::BrokerState>::store
            ((atomic<helics::BrokerBase::BrokerState> *)(in_RDI + 0x290),local_12,seq_cst);
  return true;
}

Assistant:

bool BrokerBase::setBrokerState(BrokerState newState)
{
    auto currentState = brokerState.load();
    switch (currentState) {
        case BrokerState::ERRORED:
            return (newState == BrokerState::ERRORED);
        case BrokerState::CONNECTED_ERROR:
            if (newState == BrokerState::TERMINATING) {
                newState = BrokerState::TERMINATING_ERROR;
            } else if (newState == BrokerState::TERMINATED || newState == BrokerState::ERRORED) {
                newState = BrokerState::ERRORED;
            } else {
                return (newState == BrokerState::CONNECTED_ERROR);
            }
            break;
        case BrokerState::TERMINATING_ERROR:
            if (newState == BrokerState::TERMINATED || newState == BrokerState::ERRORED) {
                newState = BrokerState::ERRORED;
            } else {
                return (newState == BrokerState::TERMINATING_ERROR);
            }
            break;
        default:
            if (newState == BrokerState::ERRORED) {
                if (currentState > BrokerState::CONNECTING &&
                    currentState < BrokerState::TERMINATING) {
                    newState = BrokerState::CONNECTED_ERROR;
                }
            }
            break;
    }

    brokerState.store(newState);
    return true;
}